

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O0

size_t FindFreeCells(void *page,size_t number,size_t index)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  uchar *mask;
  size_t sStack_40;
  char seq;
  size_t remaining;
  size_t first;
  size_t i;
  size_t index_local;
  size_t number_local;
  void *page_local;
  
  remaining = 0xffffffffffffffff;
  first = index >> 3;
  sStack_40 = number;
  do {
    if (0xf < first) {
      return 0xffffffffffffffff;
    }
    uVar3 = sStack_40;
    if ((sStack_40 < 8) &&
       (cVar1 = firstZeroBitSequence[sStack_40 - 1][*(byte *)((long)page + first + 0x10)],
       uVar3 = number, cVar1 != -1)) {
      if (sStack_40 == number) {
        return first * 8 + (long)cVar1;
      }
      uVar3 = number;
      if (cVar1 == '\0') {
        return remaining;
      }
    }
    sStack_40 = uVar3;
    if (sStack_40 == number) {
      cVar1 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
              [*(byte *)((long)page + first + 0x10)];
      sVar2 = sStack_40;
      if (cVar1 != '\0') {
        remaining = first * 8 + (long)(8 - cVar1);
        sVar2 = sStack_40 - (long)cVar1;
      }
    }
    else {
      sVar2 = number;
      if (*(char *)((long)page + first + 0x10) == '\0') {
        sVar2 = sStack_40 - 8;
      }
    }
    sStack_40 = sVar2;
    if (sStack_40 == 0) {
      return remaining;
    }
    first = first + 1;
  } while( true );
}

Assistant:

static size_t
FindFreeCells(
    void *page,     /*!< Page to look into. */
    size_t number,  /*!< Number of cells to look for. */
    size_t index)   /*!< First cell to consider. */
{
    size_t i, first = (size_t)-1, remaining;
    char seq;
    unsigned char *mask = PAGE_BITMASK(page);

    /*
     * Iterate over bytes of the bitmask to find a chain of <number> zero bits.
     */

    ASSERT(number <= AVAILABLE_CELLS);
    remaining = number;
    for (i = (index>>3); i < (CELLS_PER_PAGE>>3); i++) {
        if (remaining <= 7) {
            /*
             * End of sequence, or whole sequence for number < 8.
             * Find sequence in byte.
             */

            seq = firstZeroBitSequence[remaining-1][mask[i]];
            if (seq != -1) {
                if (remaining == number) {
                    /*
                     * Sequence fits into one byte.
                     */

                    return (i<<3) + seq;
                }

                /*
                 * Sequence spans over several bytes.
                 */

                if (seq == 0) {
                    /*
                     * Sequence is contiguous.
                     */

                    return first;
                }
            }

            /*
             * Sequence interrupted, restart.
             */

            remaining = number;
        }

        /*
         * Sequence may span over several bytes.
         */

        if (remaining == number) {
            /*
             * Beginning of sequence.
             *
             * @note leading bits actually denote trailing cells: bit 0 (LSB) is
             * first cell, bit 7 (MSB) is last.
             */

            seq = longestLeadingZeroBitSequence[mask[i]];
            if (seq) {
                first = (i<<3) + (8-seq);
                remaining -= seq;
            }
        } else {
            /*
             * Middle of sequence, look for 8 bits cleared = zero byte.
             */

            if (mask[i] == 0) {
                /*
                 * Continue sequence.
                 */

                remaining -= 8;
            } else {
                /*
                 * Sequence interrupted, restart.
                 */

                remaining = number;
            }
        }
        if (remaining == 0) {
            /*
             * End of sequence reached.
             */

            return first;
        }
    }

    /*
     * None found.
     */

    return (size_t)-1;
}